

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManCheckTopoOrder(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar3 = 0;
  while ((iVar3 < p->vCis->nSize && (pGVar2 = Gia_ManCi(p,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
    pGVar2->Value = 0;
    iVar3 = iVar3 + 1;
  }
  uVar4 = 1;
  iVar3 = 0;
  while( true ) {
    if (p->vCos->nSize <= iVar3) {
      return uVar4;
    }
    pGVar2 = Gia_ManCo(p,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManCheckTopoOrder_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff))
    ;
    uVar4 = uVar4 & uVar1;
    iVar3 = iVar3 + 1;
  }
  return uVar4;
}

Assistant:

int Gia_ManCheckTopoOrder( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, RetValue = 1;
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        RetValue &= Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin0(pObj) );
    return RetValue;
}